

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

_Bool msgpack_unpacker_flush_zone(msgpack_unpacker *mpac)

{
  _Bool _Var1;
  msgpack_unpacker *mpac_local;
  
  if ((*(byte *)((long)mpac->ctx + 8) & 1) != 0) {
    _Var1 = msgpack_zone_push_finalizer(mpac->z,decr_count,mpac->buffer);
    if (!_Var1) {
      return false;
    }
    *(undefined1 *)((long)mpac->ctx + 8) = 0;
    incr_count(mpac->buffer);
  }
  return true;
}

Assistant:

bool msgpack_unpacker_flush_zone(msgpack_unpacker* mpac)
{
    if(CTX_REFERENCED(mpac)) {
        if(!msgpack_zone_push_finalizer(mpac->z, decr_count, mpac->buffer)) {
            return false;
        }
        CTX_REFERENCED(mpac) = false;

        incr_count(mpac->buffer);
    }

    return true;
}